

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodedstream.h
# Opt level: O0

void __thiscall
rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::EncodedInputStream
          (EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *this,MemoryStream *is
          )

{
  Ch CVar1;
  MemoryStream *is_local;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *this_local;
  
  this->is_ = is;
  CVar1 = MemoryStream::Peek(this->is_);
  if (CVar1 == -0x11) {
    MemoryStream::Take(this->is_);
  }
  CVar1 = MemoryStream::Peek(this->is_);
  if (CVar1 == -0x45) {
    MemoryStream::Take(this->is_);
  }
  CVar1 = MemoryStream::Peek(this->is_);
  if (CVar1 == -0x41) {
    MemoryStream::Take(this->is_);
  }
  return;
}

Assistant:

EncodedInputStream(MemoryStream& is) : is_(is) {
        if (static_cast<unsigned char>(is_.Peek()) == 0xEFu) is_.Take();
        if (static_cast<unsigned char>(is_.Peek()) == 0xBBu) is_.Take();
        if (static_cast<unsigned char>(is_.Peek()) == 0xBFu) is_.Take();
    }